

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapFields
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  undefined1 uVar1;
  bool bVar2;
  Reflection *pRVar3;
  Descriptor *pDVar4;
  size_type sVar5;
  const_reference ppFVar6;
  OneofDescriptor *pOVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_RCX;
  int __c;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDX;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RSI;
  char *pcVar8;
  Reflection *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  Message *unaff_retaddr;
  Message *in_stack_00000008;
  Reflection *in_stack_00000010;
  OneofDescriptor *in_stack_00000138;
  Message *in_stack_00000140;
  int oneof_index;
  FieldDescriptor *field;
  int i;
  int fields_size;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffdd8;
  LogMessage *in_stack_fffffffffffffde0;
  OneofDescriptor *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  ExtensionSet *in_stack_fffffffffffffe28;
  ExtensionSet *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  Reflection *in_stack_fffffffffffffe40;
  undefined1 *in_stack_fffffffffffffe80;
  LogMessage *in_stack_fffffffffffffe88;
  LogMessage *in_stack_fffffffffffffe90;
  _Self local_108;
  _Self local_100;
  undefined4 local_f4;
  FieldDescriptor *local_f0;
  int local_e8;
  int local_e4;
  byte local_a9;
  undefined1 local_a8 [79];
  byte local_59;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_20;
  set<int,_std::less<int>,_std::allocator<int>_> *local_10;
  Reflection *field_00;
  
  if (in_RSI != in_RDX) {
    local_20 = in_RCX;
    local_10 = in_RSI;
    field_00 = in_RDI;
    pRVar3 = Message::GetReflection
                       ((Message *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    local_59 = 0;
    if (pRVar3 != in_RDI) {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffde0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdcc);
      local_59 = 1;
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      pDVar4 = Message::GetDescriptor
                         ((Message *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      Descriptor::full_name_abi_cxx11_(pDVar4);
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      Descriptor::full_name_abi_cxx11_(in_RDI->descriptor_);
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      in_stack_fffffffffffffe90 =
           internal::LogMessage::operator<<
                     ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                      (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      internal::LogFinisher::operator=
                ((LogFinisher *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    if ((local_59 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)0x425af3);
    }
    pRVar3 = Message::GetReflection
                       ((Message *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    local_a9 = 0;
    if (pRVar3 != in_RDI) {
      in_stack_fffffffffffffe80 = local_a8;
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffde0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdcc);
      local_a9 = 1;
      in_stack_fffffffffffffe88 =
           internal::LogMessage::operator<<
                     ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                      (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      pDVar4 = Message::GetDescriptor
                         ((Message *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      Descriptor::full_name_abi_cxx11_(pDVar4);
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      Descriptor::full_name_abi_cxx11_(in_RDI->descriptor_);
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      in_stack_fffffffffffffe40 =
           (Reflection *)
           internal::LogMessage::operator<<
                     ((LogMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                      (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      internal::LogFinisher::operator=
                ((LogFinisher *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    if ((local_a9 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)0x425c72);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x425c7f);
    sVar5 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(local_20);
    local_e4 = (int)sVar5;
    for (local_e8 = 0; local_e8 < local_e4; local_e8 = local_e8 + 1) {
      pcVar8 = (char *)(long)local_e8;
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](local_20,(size_type)pcVar8);
      local_f0 = *ppFVar6;
      uVar1 = FieldDescriptor::is_extension(local_f0);
      if ((bool)uVar1) {
        in_stack_fffffffffffffe30 =
             MutableExtensionSet((Reflection *)
                                 CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                                 (Message *)
                                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        in_stack_fffffffffffffe28 =
             MutableExtensionSet((Reflection *)
                                 CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                                 (Message *)
                                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        FieldDescriptor::number(local_f0);
        internal::ExtensionSet::SwapExtension
                  ((ExtensionSet *)in_stack_fffffffffffffe90,
                   (ExtensionSet *)in_stack_fffffffffffffe88,
                   (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      }
      else {
        pOVar7 = FieldDescriptor::containing_oneof(local_f0);
        if (pOVar7 == (OneofDescriptor *)0x0) {
          in_stack_fffffffffffffdd7 = FieldDescriptor::is_repeated((FieldDescriptor *)0x425f24);
          if (!(bool)in_stack_fffffffffffffdd7) {
            SwapBit(in_stack_fffffffffffffe40,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffe38),
                    (Message *)in_stack_fffffffffffffe30,
                    (FieldDescriptor *)in_stack_fffffffffffffe28);
          }
          SwapField(in_stack_00000010,in_stack_00000008,unaff_retaddr,(FieldDescriptor *)field_00);
        }
        else {
          pOVar7 = FieldDescriptor::containing_oneof(local_f0);
          pcVar8 = OneofDescriptor::index(pOVar7,pcVar8,__c);
          local_f4 = SUB84(pcVar8,0);
          local_100._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         (in_stack_fffffffffffffdd8,
                          (key_type_conflict *)
                          CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
          local_108._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          bVar2 = std::operator!=(&local_100,&local_108);
          if (!bVar2) {
            pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                               (value_type_conflict2 *)in_stack_fffffffffffffde8);
            in_stack_fffffffffffffdf7 = pVar9.second;
            in_stack_fffffffffffffdd8 = local_10;
            in_stack_fffffffffffffde8 = FieldDescriptor::containing_oneof(local_f0);
            SwapOneofField(_i,(Message *)field,in_stack_00000140,in_stack_00000138);
          }
        }
      }
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x425fad);
  }
  return;
}

Assistant:

void Reflection::SwapFields(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to SwapFields() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to SwapFields() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  std::set<int> swapped_oneof;

  const int fields_size = static_cast<int>(fields.size());
  for (int i = 0; i < fields_size; i++) {
    const FieldDescriptor* field = fields[i];
    if (field->is_extension()) {
      MutableExtensionSet(message1)->SwapExtension(
          MutableExtensionSet(message2), field->number());
    } else {
      if (field->containing_oneof()) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField(message1, message2, field->containing_oneof());
      } else {
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
        // Swap field.
        SwapField(message1, message2, field);
      }
    }
  }
}